

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lratchecker.cpp
# Opt level: O3

void __thiscall CaDiCaL::LratChecker::dump(LratChecker *this)

{
  uint uVar1;
  ulong uVar2;
  uint64_t uVar3;
  ulong uVar4;
  LratCheckerClause *pLVar5;
  uint uVar6;
  ulong uVar7;
  
  if (this->size_clauses == 0) {
    uVar4 = 0;
  }
  else {
    uVar3 = 0;
    uVar4 = 0;
    do {
      for (pLVar5 = this->clauses[uVar3]; pLVar5 != (LratCheckerClause *)0x0; pLVar5 = pLVar5->next)
      {
        if ((ulong)pLVar5->size != 0) {
          uVar7 = 0;
          do {
            uVar1 = pLVar5->literals[uVar7];
            uVar6 = -uVar1;
            if (0 < (int)uVar1) {
              uVar6 = uVar1;
            }
            uVar2 = (ulong)uVar6;
            if ((int)uVar6 <= (int)uVar4) {
              uVar2 = uVar4;
            }
            uVar4 = uVar2;
            uVar7 = uVar7 + 1;
          } while (pLVar5->size != uVar7);
        }
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != this->size_clauses);
  }
  printf("p cnf %d %lu\n",uVar4,this->num_clauses);
  uVar4 = this->size_clauses;
  if (uVar4 != 0) {
    uVar7 = 0;
    do {
      pLVar5 = this->clauses[uVar7];
      if (pLVar5 != (LratCheckerClause *)0x0) {
        do {
          if (pLVar5->size != 0) {
            uVar4 = 0;
            do {
              printf("%d ",(ulong)(uint)pLVar5->literals[uVar4]);
              uVar4 = uVar4 + 1;
            } while (uVar4 < pLVar5->size);
          }
          puts("0");
          pLVar5 = pLVar5->next;
        } while (pLVar5 != (LratCheckerClause *)0x0);
        uVar4 = this->size_clauses;
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar4);
  }
  return;
}

Assistant:

void LratChecker::dump () {
  int max_var = 0;
  for (uint64_t i = 0; i < size_clauses; i++)
    for (LratCheckerClause *c = clauses[i]; c; c = c->next)
      for (unsigned i = 0; i < c->size; i++)
        if (abs (c->literals[i]) > max_var)
          max_var = abs (c->literals[i]);
  printf ("p cnf %d %" PRIu64 "\n", max_var, num_clauses);
  for (uint64_t i = 0; i < size_clauses; i++)
    for (LratCheckerClause *c = clauses[i]; c; c = c->next) {
      for (unsigned i = 0; i < c->size; i++)
        printf ("%d ", c->literals[i]);
      printf ("0\n");
    }
}